

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void multipredict<false>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                        polyprediction *pred,bool finalize_predictions)

{
  double dVar1;
  vw *all;
  polyprediction *ppVar2;
  size_t sVar3;
  bool bVar4;
  float fVar5;
  multipredict_info<sparse_parameters> local_48;
  
  all = b->all;
  ppVar2 = pred;
  sVar3 = count;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    ppVar2->scalar = (ec->l).simple.initial;
    ppVar2 = ppVar2 + 1;
  }
  local_48.count = count;
  local_48.step = step;
  local_48.pred = pred;
  if ((b->all->weights).sparse == false) {
    local_48.weights = (sparse_parameters *)&(all->weights).dense_weights;
    local_48.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_48);
  }
  else {
    local_48.weights = &(all->weights).sparse_weights;
    local_48.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_48);
  }
  dVar1 = all->sd->contraction;
  ppVar2 = pred;
  sVar3 = count;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    while (sVar3 != 0) {
      ppVar2->scalar = (float)all->sd->contraction * ppVar2->scalar;
      ppVar2 = ppVar2 + 1;
      sVar3 = sVar3 - 1;
    }
  }
  if (finalize_predictions) {
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      fVar5 = GD::finalize_prediction(all->sd,pred->scalar);
      pred->scalar = fVar5;
      pred = pred + 1;
    }
  }
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}